

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadXYZnodeBodySpring::ComputeForce
          (ChLoadXYZnodeBodySpring *this,ChFrameMoving<double> *rel_AB,ChVector<double> *loc_force)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  dVar1 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[0];
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1;
  dVar18 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1];
  dVar2 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar2;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = dVar18 * dVar18;
  auVar10 = vfmadd231sd_fma(auVar10,auVar14,auVar14);
  auVar10 = vfmadd231sd_fma(auVar10,auVar17,auVar17);
  if (auVar10._0_8_ < 0.0) {
    dVar16 = sqrt(auVar10._0_8_);
  }
  else {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar16 = auVar10._0_8_;
  }
  auVar11._8_8_ = 0;
  auVar11._0_8_ = (rel_AB->super_ChFrame<double>).coord.pos.m_data[0];
  dVar9 = (rel_AB->super_ChFrame<double>).coord.pos.m_data[1];
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar9 * dVar9;
  auVar10 = vfmadd231sd_fma(auVar15,auVar11,auVar11);
  auVar12._8_8_ = 0;
  auVar12._0_8_ = (rel_AB->super_ChFrame<double>).coord.pos.m_data[2];
  auVar10 = vfmadd213sd_fma(auVar12,auVar12,auVar10);
  if (auVar10._0_8_ < 0.0) {
    dVar9 = sqrt(auVar10._0_8_);
  }
  else {
    auVar10 = vsqrtsd_avx(auVar10,auVar10);
    dVar9 = auVar10._0_8_;
  }
  bVar6 = 2.2250738585072014e-308 <= dVar16;
  dVar16 = 1.0 / dVar16;
  dVar2 = (double)((ulong)bVar6 * (long)(dVar16 * dVar2));
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar2;
  auVar8._0_8_ = (double)((ulong)bVar6 * (long)(dVar16 * dVar1) + (ulong)!bVar6 * 0x3ff0000000000000
                         );
  auVar8._8_8_ = 0;
  dVar1 = (double)((ulong)bVar6 * (long)(dVar16 * dVar18));
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (rel_AB->coord_dt).pos.m_data[0];
  auVar19._8_8_ = 0;
  auVar19._0_8_ = dVar1 * (rel_AB->coord_dt).pos.m_data[1];
  auVar10 = vfmadd231sd_fma(auVar19,auVar8,auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (rel_AB->coord_dt).pos.m_data[2];
  auVar10 = vfmadd231sd_fma(auVar10,auVar7,auVar4);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = this->K;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = dVar9 - this->d_0;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = auVar10._0_8_ * this->R;
  auVar10 = vfnmsub231sd_fma(auVar20,auVar13,auVar5);
  dVar18 = auVar10._0_8_;
  loc_force->m_data[0] = auVar8._0_8_ * dVar18;
  loc_force->m_data[1] = dVar1 * dVar18;
  loc_force->m_data[2] = dVar2 * dVar18;
  return;
}

Assistant:

void ChLoadXYZnodeBodySpring:: ComputeForce(const ChFrameMoving<>& rel_AB,
                               ChVector<>& loc_force) {
		ChVector<> BA = rel_AB.GetPos().GetNormalized();
		double d = rel_AB.GetPos().Length() - d_0;
		double d_dt = Vdot(rel_AB.GetPos_dt(), BA);
		loc_force = (-K * d - R * d_dt) * BA;
}